

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestReferenceCounting::TextureViewTestReferenceCounting
          (TextureViewTestReferenceCounting *this,Context *context)

{
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  *this_00;
  _norm_vec4 local_1c;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"reference_counting",
             "Makes sure that sampling from views, for which the parent texture object has already been deleted, works correctly."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureViewTestReferenceCounting_021269c0;
  this->m_bo_id = 0;
  this->m_parent_to_id = 0;
  this->m_po_id = 0;
  this->m_po_expected_texel_uniform_location = -1;
  this->m_po_lod_uniform_location = -1;
  this->m_vao_id = 0;
  this->m_view_to_id = 0;
  this->m_view_view_to_id = 0;
  this->m_vs_id = 0;
  this->m_texture_height = 0x40;
  this->m_texture_n_levels = 7;
  this->m_texture_width = 0x40;
  this_00 = &this->m_mipmap_colors;
  (this->m_mipmap_colors).
  super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mipmap_colors).
  super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mipmap_colors).
  super__Vector_base<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builtin_memcpy(local_1c.rgba,"{\"8N",4);
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::emplace_back<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>(this_00,&local_1c);
  local_1c.rgba[0] = 0xea;
  local_1c.rgba[1] = '-';
  local_1c.rgba[2] = 'C';
  local_1c.rgba[3] = 'Y';
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::emplace_back<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>(this_00,&local_1c);
  builtin_memcpy(local_1c.rgba,"\"8NZ",4);
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::emplace_back<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>(this_00,&local_1c);
  builtin_memcpy(local_1c.rgba,"-CY\x01",4);
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::emplace_back<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>(this_00,&local_1c);
  builtin_memcpy(local_1c.rgba,"8NZ{",4);
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::emplace_back<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>(this_00,&local_1c);
  local_1c.rgba[0] = 'C';
  local_1c.rgba[1] = 'Y';
  local_1c.rgba[2] = '\x01';
  local_1c.rgba[3] = 0xea;
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::emplace_back<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>(this_00,&local_1c);
  builtin_memcpy(local_1c.rgba,"NZ\f\"",4);
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::emplace_back<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>(this_00,&local_1c);
  return;
}

Assistant:

TextureViewTestReferenceCounting::TextureViewTestReferenceCounting(deqp::Context& context)
	: TestCase(context, "reference_counting",
			   "Makes sure that sampling from views, for which the parent texture object "
			   "has already been deleted, works correctly.")
	, m_bo_id(0)
	, m_parent_to_id(0)
	, m_po_id(0)
	, m_po_expected_texel_uniform_location(-1)
	, m_po_lod_uniform_location(-1)
	, m_vao_id(0)
	, m_view_to_id(0)
	, m_view_view_to_id(0)
	, m_vs_id(0)
	, m_texture_height(64)
	, m_texture_n_levels(7)
	, m_texture_width(64)
{
	/* Configure a vector storing unique colors that should be used
	 * for filling subsequent mip-maps of parent texture */
	m_mipmap_colors.push_back(_norm_vec4(123, 34, 56, 78));
	m_mipmap_colors.push_back(_norm_vec4(234, 45, 67, 89));
	m_mipmap_colors.push_back(_norm_vec4(34, 56, 78, 90));
	m_mipmap_colors.push_back(_norm_vec4(45, 67, 89, 1));
	m_mipmap_colors.push_back(_norm_vec4(56, 78, 90, 123));
	m_mipmap_colors.push_back(_norm_vec4(67, 89, 1, 234));
	m_mipmap_colors.push_back(_norm_vec4(78, 90, 12, 34));

	DE_ASSERT(m_mipmap_colors.size() == m_texture_n_levels);
}